

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O0

GLuint __thiscall
glcts::anon_unknown_0::TGBase::CreateProgram(TGBase *this,char *src_vs,char *src_fs)

{
  GLuint program;
  GLuint GVar1;
  GLuint sh_1;
  GLuint sh;
  GLuint p;
  char *src_fs_local;
  char *src_vs_local;
  TGBase *this_local;
  
  _sh = src_fs;
  src_fs_local = src_vs;
  src_vs_local = (char *)this;
  program = glu::CallLogWrapper::glCreateProgram
                      (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper);
  if (src_fs_local != (char *)0x0) {
    GVar1 = glu::CallLogWrapper::glCreateShader
                      (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8b31);
    glu::CallLogWrapper::glAttachShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program,GVar1);
    glu::CallLogWrapper::glDeleteShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1);
    glu::CallLogWrapper::glShaderSource
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1,1,&src_fs_local
               ,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1);
  }
  if (_sh != (char *)0x0) {
    GVar1 = glu::CallLogWrapper::glCreateShader
                      (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8b30);
    glu::CallLogWrapper::glAttachShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program,GVar1);
    glu::CallLogWrapper::glDeleteShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1);
    glu::CallLogWrapper::glShaderSource
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1,1,
               (GLchar **)&sh,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar1);
  }
  return program;
}

Assistant:

GLuint CreateProgram(const char* src_vs, const char* src_fs)
	{
		const GLuint p = glCreateProgram();
		if (src_vs)
		{
			GLuint sh = glCreateShader(GL_VERTEX_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_vs, NULL);
			glCompileShader(sh);
		}
		if (src_fs)
		{
			GLuint sh = glCreateShader(GL_FRAGMENT_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_fs, NULL);
			glCompileShader(sh);
		}
		return p;
	}